

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_read_coc(opj_j2k_t *j2k)

{
  opj_image_t *poVar1;
  opj_cio_t *cio;
  uint compno;
  uint uVar2;
  opj_tcp_t *poVar3;
  
  if (j2k->state == 0x10) {
    poVar3 = j2k->cp->tcps + j2k->curtileno;
  }
  else {
    poVar3 = j2k->default_tcp;
  }
  poVar1 = j2k->image;
  cio = j2k->cio;
  cio_read(cio,2);
  compno = cio_read(cio,2 - (uint)(poVar1->numcomps < 0x101));
  uVar2 = cio_read(cio,1);
  poVar3->tccps[(int)compno].csty = uVar2;
  j2k_read_cox(j2k,compno);
  return;
}

Assistant:

static void j2k_read_coc(opj_j2k_t *j2k) {
	int len, compno;

	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = j2k->state == J2K_STATE_TPH ? &cp->tcps[j2k->curtileno] : j2k->default_tcp;
	opj_image_t *image = j2k->image;
	opj_cio_t *cio = j2k->cio;
	
	len = cio_read(cio, 2);		/* Lcoc */
	compno = cio_read(cio, image->numcomps <= 256 ? 1 : 2);	/* Ccoc */
	tcp->tccps[compno].csty = cio_read(cio, 1);	/* Scoc */
	j2k_read_cox(j2k, compno);
}